

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFont * __thiscall
ImFontAtlas::AddFontFromFileTTF
          (ImFontAtlas *this,char *filename,float size_pixels,ImFontConfig *font_cfg_template,
          ImWchar *glyph_ranges)

{
  char *pcVar1;
  void *ttf_data;
  size_t sVar2;
  char *pcVar3;
  ImFont *pIVar4;
  size_t data_size;
  ImFontConfig local_b8;
  
  if (this->Locked == true) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                  ,0x681,
                  "ImFont *ImFontAtlas::AddFontFromFileTTF(const char *, float, const ImFontConfig *, const ImWchar *)"
                 );
  }
  data_size = 0;
  ttf_data = ImFileLoadToMemory(filename,"rb",&data_size,0);
  if (ttf_data == (void *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                  ,0x686,
                  "ImFont *ImFontAtlas::AddFontFromFileTTF(const char *, float, const ImFontConfig *, const ImWchar *)"
                 );
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    local_b8.FontData = (void *)0x0;
    local_b8.FontDataSize = 0;
    local_b8.FontDataOwnedByAtlas = true;
    local_b8.FontNo = 0;
    local_b8.SizePixels = 0.0;
    local_b8.OversampleH = 3;
    local_b8.OversampleV = 1;
    local_b8.PixelSnapH = false;
    local_b8.GlyphRanges = (ImWchar *)0x0;
    local_b8.GlyphExtraSpacing.x = 0.0;
    local_b8.GlyphExtraSpacing.y = 0.0;
    local_b8.GlyphOffset.x = 0.0;
    local_b8.GlyphOffset.y = 0.0;
    local_b8.GlyphMinAdvanceX = 0.0;
    local_b8.GlyphMaxAdvanceX = 3.4028235e+38;
    local_b8.MergeMode = false;
    local_b8.RasterizerFlags = 0;
    local_b8.RasterizerMultiply = 1.0;
    local_b8.Name[0] = '\0';
    local_b8.Name[1] = '\0';
    local_b8.Name[2] = '\0';
    local_b8.Name[3] = '\0';
    local_b8.Name[4] = '\0';
    local_b8.Name[5] = '\0';
    local_b8.Name[6] = '\0';
    local_b8.Name[7] = '\0';
    local_b8.Name[8] = '\0';
    local_b8.Name[9] = '\0';
    local_b8.Name[10] = '\0';
    local_b8.Name[0xb] = '\0';
    local_b8.Name[0xc] = '\0';
    local_b8.Name[0xd] = '\0';
    local_b8.Name[0xe] = '\0';
    local_b8.Name[0xf] = '\0';
    local_b8.Name[0x20] = '\0';
    local_b8.Name[0x21] = '\0';
    local_b8.Name[0x22] = '\0';
    local_b8.Name[0x23] = '\0';
    local_b8.Name[0x24] = '\0';
    local_b8.Name[0x25] = '\0';
    local_b8.Name[0x26] = '\0';
    local_b8.Name[0x27] = '\0';
    local_b8.Name[0x10] = '\0';
    local_b8.Name[0x11] = '\0';
    local_b8.Name[0x12] = '\0';
    local_b8.Name[0x13] = '\0';
    local_b8.Name[0x14] = '\0';
    local_b8.Name[0x15] = '\0';
    local_b8.Name[0x16] = '\0';
    local_b8.Name[0x17] = '\0';
    local_b8.Name[0x18] = '\0';
    local_b8.Name[0x19] = '\0';
    local_b8.Name[0x1a] = '\0';
    local_b8.Name[0x1b] = '\0';
    local_b8.Name[0x1c] = '\0';
    local_b8.Name[0x1d] = '\0';
    local_b8.Name[0x1e] = '\0';
    local_b8.Name[0x1f] = '\0';
    local_b8.DstFont = (ImFont *)0x0;
  }
  else {
    memcpy(&local_b8,font_cfg_template,0x88);
    if (local_b8.Name[0] != '\0') goto LAB_002fcd45;
  }
  sVar2 = strlen(filename);
  pcVar3 = filename + sVar2;
  do {
    if ((pcVar3 <= filename) || (pcVar1 = pcVar3 + -1, *pcVar1 == '\\')) break;
    pcVar3 = pcVar3 + -1;
  } while (*pcVar1 != '/');
  ImFormatString(local_b8.Name,0x28,"%s, %.0fpx",SUB84((double)size_pixels,0));
LAB_002fcd45:
  pIVar4 = AddFontFromMemoryTTF(this,ttf_data,(int)data_size,size_pixels,&local_b8,glyph_ranges);
  return pIVar4;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromFileTTF(const char* filename, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    size_t data_size = 0;
    void* data = ImFileLoadToMemory(filename, "rb", &data_size, 0);
    if (!data)
    {
        IM_ASSERT(0); // Could not load file.
        return NULL;
    }
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    if (font_cfg.Name[0] == '\0')
    {
        // Store a short copy of filename into into the font name for convenience
        const char* p;
        for (p = filename + strlen(filename); p > filename && p[-1] != '/' && p[-1] != '\\'; p--) {}
        ImFormatString(font_cfg.Name, IM_ARRAYSIZE(font_cfg.Name), "%s, %.0fpx", p, size_pixels);
    }
    return AddFontFromMemoryTTF(data, (int)data_size, size_pixels, &font_cfg, glyph_ranges);
}